

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scrollbar.cxx
# Opt level: O3

void __thiscall Fl_Scrollbar::draw(Fl_Scrollbar *this)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Color FVar7;
  uint uVar8;
  _func_int **pp_Var9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  if ((char)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.damage_ < '\0') {
    Fl_Widget::draw_box((Fl_Widget *)this);
  }
  iVar10 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.x_;
  iVar3 = Fl::box_dx((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar3 = iVar3 + iVar10;
  iVar10 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.y_;
  iVar4 = Fl::box_dy((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar4 = iVar4 + iVar10;
  iVar10 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.w_;
  iVar5 = Fl::box_dw((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar10 = iVar10 - iVar5;
  iVar5 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_;
  iVar6 = Fl::box_dh((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar5 = iVar5 - iVar6;
  if (((this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.type_ & 1) == 0) {
    if (SBORROW4(iVar5,iVar10 * 3) != iVar5 + iVar10 * -3 < 0) {
LAB_001c89db:
      Fl_Slider::draw(&this->super_Fl_Slider,iVar3,iVar4,iVar10,iVar5);
      return;
    }
    Fl_Slider::draw(&this->super_Fl_Slider,iVar3,iVar10 + iVar4,iVar10,iVar5 + iVar10 * -2);
    if (-1 < (char)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.damage_) {
      return;
    }
    bVar2 = (this->super_Fl_Slider).slider_;
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)((1 < bVar2 && this->pushed_ == 1) | bVar2),iVar3,
                        iVar4,iVar10,iVar10,
                        (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color2_);
    bVar2 = (this->super_Fl_Slider).slider_;
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)((1 < bVar2 && this->pushed_ == 2) | bVar2),iVar3,
                        (iVar4 - iVar10) + iVar5,iVar10,iVar10,
                        (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color2_);
    iVar6 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar7 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.label_.color;
    if (iVar6 == 0) {
      FVar7 = fl_inactive(FVar7);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar7);
    uVar13 = (iVar10 + -4) / 3;
    uVar14 = 1;
    if (1 < (int)uVar13) {
      uVar14 = uVar13;
    }
    uVar12 = uVar14 * 2;
    uVar11 = (int)(~uVar12 + iVar10) / 2 + iVar3;
    iVar4 = (int)(~uVar14 + iVar10) / 2 + iVar4;
    if ((Fl::scheme_ == (char *)0x0) || (iVar3 = strcmp("gtk+",Fl::scheme_), iVar3 != 0)) {
      uVar8 = uVar11 + uVar14;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
                (fl_graphics_driver,(ulong)uVar11,(ulong)(iVar4 + uVar14),(ulong)(uVar12 + uVar11),
                 (ulong)(iVar4 + uVar14),(ulong)uVar8,iVar4);
      uVar15 = (iVar5 - iVar10) + iVar4;
      uVar13 = uVar14 + uVar15;
      pp_Var9 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
      uVar1 = uVar11;
      uVar12 = uVar12 + uVar11;
      uVar14 = uVar15;
    }
    else {
      uVar1 = uVar11 + uVar14;
      uVar8 = uVar12 + uVar11;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x17])
                (fl_graphics_driver,(ulong)uVar11,(ulong)(iVar4 + uVar14),(ulong)uVar1,
                 (ulong)((iVar4 + uVar14) - 1),(ulong)uVar8,iVar4 + uVar14,uVar1,iVar4);
      uVar13 = iVar4 + (iVar5 - iVar10);
      uVar15 = (iVar5 - iVar10) + iVar4 + 1;
      uVar14 = uVar14 + uVar13;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
                (fl_graphics_driver,(ulong)uVar11,(ulong)uVar13,(ulong)uVar1,(ulong)uVar15,
                 (ulong)uVar1,uVar14);
      pp_Var9 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
      uVar12 = uVar1;
    }
  }
  else {
    if (SBORROW4(iVar10,iVar5 * 3) != iVar10 + iVar5 * -3 < 0) goto LAB_001c89db;
    Fl_Slider::draw(&this->super_Fl_Slider,iVar5 + iVar3,iVar4,iVar10 + iVar5 * -2,iVar5);
    if (-1 < (char)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.damage_) {
      return;
    }
    bVar2 = (this->super_Fl_Slider).slider_;
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)((1 < bVar2 && this->pushed_ == 1) | bVar2),iVar3,
                        iVar4,iVar5,iVar5,
                        (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color2_);
    bVar2 = (this->super_Fl_Slider).slider_;
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)((1 < bVar2 && this->pushed_ == 2) | bVar2),
                        (iVar10 + iVar3) - iVar5,iVar4,iVar5,iVar5,
                        (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color2_);
    iVar6 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar7 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.label_.color;
    if (iVar6 == 0) {
      FVar7 = fl_inactive(FVar7);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar7);
    uVar13 = (iVar5 + -4) / 3;
    uVar14 = 1;
    if (1 < (int)uVar13) {
      uVar14 = uVar13;
    }
    uVar8 = (int)(~uVar14 + iVar5) / 2 + iVar3;
    uVar13 = uVar14 * 2;
    uVar15 = (int)(~uVar13 + iVar5) / 2 + iVar4;
    if ((Fl::scheme_ != (char *)0x0) && (iVar3 = strcmp("gtk+",Fl::scheme_), iVar3 == 0)) {
      uVar1 = uVar15 + uVar14;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x17])
                (fl_graphics_driver,(ulong)uVar8,(ulong)uVar1,(ulong)(uVar8 + uVar14),
                 (ulong)(uVar13 + uVar15),(ulong)((uVar8 - 1) + uVar14),uVar1,uVar8 + uVar14,uVar15)
      ;
      uVar12 = uVar8 + (iVar10 - iVar5);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x17])
                (fl_graphics_driver,(ulong)uVar12,(ulong)uVar15,
                 (ulong)((iVar10 - iVar5) + uVar8 + 1),(ulong)uVar1,(ulong)uVar12,uVar13 + uVar15,
                 uVar14 + uVar12,uVar1);
      return;
    }
    uVar13 = uVar13 + uVar15;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
              (fl_graphics_driver,(ulong)uVar8,(ulong)(uVar15 + uVar14),(ulong)(uVar8 + uVar14),
               (ulong)uVar13,(ulong)(uVar8 + uVar14),uVar15);
    uVar8 = (iVar10 - iVar5) + uVar8;
    pp_Var9 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    uVar1 = uVar8;
    uVar12 = uVar14 + uVar8;
    uVar14 = uVar15 + uVar14;
  }
  (*pp_Var9[0x16])(fl_graphics_driver,(ulong)uVar1,(ulong)uVar15,(ulong)uVar8,(ulong)uVar13,
                   (ulong)uVar12,uVar14);
  return;
}

Assistant:

void Fl_Scrollbar::draw() {
  if (damage()&FL_DAMAGE_ALL) draw_box();
  int X = x()+Fl::box_dx(box());
  int Y = y()+Fl::box_dy(box());
  int W = w()-Fl::box_dw(box());
  int H = h()-Fl::box_dh(box());
  if (horizontal()) {
    if (W < 3*H) {Fl_Slider::draw(X,Y,W,H); return;}
    Fl_Slider::draw(X+H,Y,W-2*H,H);
    if (damage()&FL_DAMAGE_ALL) {
      draw_box((pushed_==1) ? fl_down(slider()) : slider(),
	       X, Y, H, H, selection_color());
      draw_box((pushed_==2) ? fl_down(slider()) : slider(),
	       X+W-H, Y, H, H, selection_color());
      if (active_r())
        fl_color(labelcolor());
      else
        fl_color(fl_inactive(labelcolor()));
      int w1 = (H-4)/3; if (w1 < 1) w1 = 1;
      int x1 = X+(H-w1-1)/2;
      int yy1 = Y+(H-2*w1-1)/2;
      if (Fl::is_scheme("gtk+")) {
	fl_polygon(x1, yy1+w1, x1+w1, yy1+2*w1, x1+w1-1, yy1+w1, x1+w1, yy1);
	x1 += (W-H);
	fl_polygon(x1, yy1, x1+1, yy1+w1, x1, yy1+2*w1, x1+w1, yy1+w1);
      } else {
	fl_polygon(x1, yy1+w1, x1+w1, yy1+2*w1, x1+w1, yy1);
	x1 += (W-H);
	fl_polygon(x1, yy1, x1, yy1+2*w1, x1+w1, yy1+w1);
      }
    }
  } else { // vertical
    if (H < 3*W) {Fl_Slider::draw(X,Y,W,H); return;}
    Fl_Slider::draw(X,Y+W,W,H-2*W);
    if (damage()&FL_DAMAGE_ALL) {
      draw_box((pushed_==1) ? fl_down(slider()) : slider(),
	       X, Y, W, W, selection_color());
      draw_box((pushed_==2) ? fl_down(slider()) : slider(),
	       X, Y+H-W, W, W, selection_color());
      if (active_r())
        fl_color(labelcolor());
      else
        fl_color(fl_inactive(labelcolor()));
      int w1 = (W-4)/3; if (w1 < 1) w1 = 1;
      int x1 = X+(W-2*w1-1)/2;
      int yy1 = Y+(W-w1-1)/2;
      if (Fl::is_scheme("gtk+")) {
	fl_polygon(x1, yy1+w1, x1+w1, yy1+w1-1, x1+2*w1, yy1+w1, x1+w1, yy1);
	yy1 += H-W;
	fl_polygon(x1, yy1, x1+w1, yy1+1, x1+w1, yy1+w1);
	fl_polygon(x1+w1, yy1+1, x1+2*w1, yy1, x1+w1, yy1+w1);
      } else {
	fl_polygon(x1, yy1+w1, x1+2*w1, yy1+w1, x1+w1, yy1);
	yy1 += H-W;
	fl_polygon(x1, yy1, x1+w1, yy1+w1, x1+2*w1, yy1);
      }
    }
  }
}